

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O0

uint32 __thiscall Clasp::DynamicLimit::restart(DynamicLimit *this,uint32 maxLBD,float k)

{
  uint32 uVar1;
  uint in_ESI;
  DynamicLimit *in_RDI;
  bool bVar2;
  double dVar3;
  bool sx;
  double rLen;
  uint32 uLim;
  float rk;
  Type nt;
  Keep in_stack_ffffffffffffffbc;
  Type in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  (in_RDI->adjust).restarts = (in_RDI->adjust).restarts + 1;
  if (((in_RDI->adjust).limit != 0xffffffff) && ((in_RDI->adjust).limit <= (in_RDI->adjust).samples)
     ) {
    in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc & 0xffffff;
    if (in_ESI != 0) {
      dVar3 = Global::avg((Global *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          (Type)in_stack_ffffffffffffffcc);
      in_stack_ffffffffffffffbc = CONCAT13((double)in_ESI < dVar3,(int3)in_stack_ffffffffffffffbc);
    }
    uVar1 = (in_RDI->adjust).limit;
    if ((uint)((char)(in_stack_ffffffffffffffbc >> 0x18) != '\0') == (in_RDI->adjust).type) {
      dVar3 = anon_struct_20_5_f528b763_for_adjust::avgRestart
                        ((anon_struct_20_5_f528b763_for_adjust *)0x201d24);
      bVar2 = (in_RDI->adjust).limit <= in_RDI->num_;
      in_stack_ffffffffffffffd4 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffffd4);
      if ((dVar3 < 16000.0) && (bVar2)) {
        in_stack_ffffffffffffffd0 = 16000;
        in_stack_ffffffffffffffcc = (float)(uVar1 - 10000);
        std::max<unsigned_int>((uint *)&stack0xffffffffffffffd0,(uint *)&stack0xffffffffffffffcc);
      }
    }
    resetAdjust((DynamicLimit *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,(uint32)((ulong)in_RDI >> 0x20),
                SUB81((ulong)in_RDI >> 0x18,0));
  }
  resetRun(in_RDI,in_stack_ffffffffffffffbc);
  return (in_RDI->adjust).limit;
}

Assistant:

uint32 DynamicLimit::restart(uint32 maxLBD, float k) {
	++adjust.restarts;
	if (adjust.limit != UINT32_MAX && adjust.samples >= adjust.limit) {
		Type   nt   = maxLBD && global_.avg(lbd_limit) > maxLBD ? level_limit : lbd_limit;
		float  rk   = adjust.rk;
		uint32 uLim = adjust.limit;
		if (nt == adjust.type) {
			double rLen = adjust.avgRestart();
			bool   sx   = num_ >= adjust.limit;
			if      (rLen >= 16000.0) { rk += 0.1f;  uLim = 16000; }
			else if (sx)              { rk += 0.05f; uLim = std::max(uint32(16000), uLim-10000); }
			else if (rLen >= 4000.0)  { rk += 0.05f; }
			else if (rLen >= 1000.0)  { uLim += 10000u; }
			else if (rk > k)          { rk -= 0.05f; }
		}
		resetAdjust(rk, nt, uLim);
	}
	resetRun(RestartSchedule::keep_restart);
	return adjust.limit;
}